

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_butcher.c
# Opt level: O0

void ARKodeButcherTable_Space(ARKodeButcherTable B,sunindextype *liw,sunindextype *lrw)

{
  sunindextype *lrw_local;
  sunindextype *liw_local;
  ARKodeButcherTable B_local;
  
  *liw = 0;
  *lrw = 0;
  if (B != (ARKodeButcherTable)0x0) {
    *liw = 3;
    if (B->d == (sunrealtype *)0x0) {
      *lrw = (long)(B->stages * (B->stages + 2));
    }
    else {
      *lrw = (long)(B->stages * (B->stages + 3));
    }
  }
  return;
}

Assistant:

void ARKodeButcherTable_Space(ARKodeButcherTable B, sunindextype* liw,
                              sunindextype* lrw)
{
  /* initialize outputs and return if B is not allocated */
  *liw = 0;
  *lrw = 0;
  if (B == NULL) { return; }

  /* fill outputs based on B */
  *liw = 3;
  if (B->d != NULL) { *lrw = B->stages * (B->stages + 3); }
  else { *lrw = B->stages * (B->stages + 2); }
}